

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_hash.c
# Opt level: O0

void bashHashStepG_internal(size_t hash_len,void *state)

{
  octet *in_RSI;
  bash_hash_st *st;
  octet c;
  octet *block;
  
  block = in_RSI;
  memCopy(in_RSI,in_RSI,0x133800);
  c = (octet)((ulong)in_RSI >> 0x38);
  if (*(long *)(in_RSI + 0x188) == 0) {
    memSet(block,c,0x133877);
    in_RSI[0xc0] = '@';
  }
  else {
    memSet(block,c,0x133841);
    in_RSI[*(long *)(in_RSI + 0x188) + 0xc0] = '@';
  }
  bashF(block,in_RSI);
  return;
}

Assistant:

static void bashHashStepG_internal(size_t hash_len, void* state)
{
	bash_hash_st* st = (bash_hash_st*)state;
	ASSERT(memIsValid(st, bashHash_keep()));
	ASSERT(st->buf_len + hash_len * 2 <= 192);
	// создать копию s
	memCopy(st->s1, st->s, sizeof(st->s));
	// есть необработанные данные?
	if (st->pos)
	{
		memSetZero(st->s1 + st->pos, st->buf_len - st->pos);
		st->s1[st->pos] = 0x40;
	}
	// дополнительный блок
	else
	{
		memSetZero(st->s1, st->buf_len);
		st->s1[0] = 0x40;
	}
	// последний шаг
	bashF(st->s1, st->stack);
}